

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ParamSpec * google::protobuf::internal::GenericTypeHandler<caffe::ParamSpec>::New(Arena *arena)

{
  Arena *arena_local;
  ParamSpec *local_28;
  ParamSpec *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ParamSpec *)operator_new(0x30);
    caffe::ParamSpec::ParamSpec(local_28);
  }
  else {
    local_28 = (ParamSpec *)
               Arena::AllocateAligned(arena,(type_info *)&caffe::ParamSpec::typeinfo,0x30);
    caffe::ParamSpec::ParamSpec(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<caffe::ParamSpec>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }